

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

void * MPIU_Scatter(MPI_Comm comm,int root,void *sendbuffer,void *recvbuffer,int nrecv,size_t elsize
                   ,int *totalnsend)

{
  long lVar1;
  undefined4 *puVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  MPI_Comm poVar7;
  undefined4 *puVar8;
  size_t size;
  undefined8 auStack_b0 [2];
  int aiStack_a0 [2];
  undefined8 auStack_98 [2];
  undefined4 auStack_88 [2];
  undefined8 *local_80;
  long local_78;
  undefined4 *local_70;
  int local_64;
  ulong uStack_60;
  int i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined8 local_48;
  MPI_Datatype dtype;
  int ThisTask;
  int NTask;
  size_t elsize_local;
  void *pvStack_28;
  int nrecv_local;
  void *recvbuffer_local;
  void *sendbuffer_local;
  MPI_Comm poStack_10;
  int root_local;
  MPI_Comm comm_local;
  
  auStack_98[1] = 0x1062b3;
  _ThisTask = elsize;
  elsize_local._4_4_ = nrecv;
  pvStack_28 = recvbuffer;
  recvbuffer_local = sendbuffer;
  sendbuffer_local._4_4_ = root;
  poStack_10 = comm;
  MPI_Comm_size(comm,(long)&dtype + 4);
  auStack_98[1] = 0x1062c0;
  MPI_Comm_rank(poStack_10,&dtype);
  local_80 = &local_48;
  auStack_98[1] = 0x1062d7;
  MPI_Type_contiguous(_ThisTask & 0xffffffff,&ompi_mpi_byte);
  auStack_98[1] = 0x1062e0;
  MPI_Type_commit(local_80);
  poVar7 = poStack_10;
  __vla_expr1 = (unsigned_long)dtype._4_4_;
  local_78 = (long)auStack_88 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
  uStack_60 = (ulong)(dtype._4_4_ + 1);
  puVar8 = (undefined4 *)(local_78 - (uStack_60 * 4 + 0xf & 0xfffffffffffffff0));
  local_70 = puVar8;
  __vla_expr0 = (unsigned_long)auStack_88;
  puVar8[-4] = sendbuffer_local._4_4_;
  *(MPI_Comm *)(puVar8 + -2) = poVar7;
  *(undefined8 *)(puVar8 + -6) = 0x10635a;
  MPI_Gather((long)&elsize_local + 4,1,&ompi_mpi_int);
  *local_70 = 0;
  for (local_64 = 1; local_64 <= (int)dtype._4_4_; local_64 = local_64 + 1) {
    local_70[local_64] = local_70[local_64 + -1] + *(int *)(local_78 + (long)(local_64 + -1) * 4);
  }
  if (pvStack_28 == (void *)0x0) {
    size = _ThisTask * (long)elsize_local._4_4_;
    *(undefined8 *)(puVar8 + -2) = 0x1063d4;
    pvStack_28 = mpiu_malloc("recvbuffer",size,
                             "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/mp-mpiu.c"
                             ,0x14f);
  }
  poVar7 = poStack_10;
  iVar6 = sendbuffer_local._4_4_;
  pvVar5 = recvbuffer_local;
  pvVar4 = pvStack_28;
  iVar3 = elsize_local._4_4_;
  puVar2 = local_70;
  lVar1 = local_78;
  if ((int)dtype == sendbuffer_local._4_4_) {
    if (totalnsend != (int *)0x0) {
      *totalnsend = local_70[(int)dtype._4_4_];
    }
  }
  else if (totalnsend != (int *)0x0) {
    *totalnsend = 0;
  }
  *(undefined8 *)(puVar8 + -8) = local_48;
  puVar8[-6] = iVar6;
  *(MPI_Comm *)(puVar8 + -4) = poVar7;
  *(undefined8 *)(puVar8 + -10) = 0x106448;
  MPI_Scatterv(pvVar5,lVar1,puVar2,local_48,pvVar4,iVar3);
  *(undefined8 *)(puVar8 + -2) = 0x106455;
  MPI_Type_free(&local_48);
  return pvStack_28;
}

Assistant:

void *
MPIU_Scatter (MPI_Comm comm, int root, const void * sendbuffer, void * recvbuffer, int nrecv, size_t elsize, int * totalnsend)
{
    int NTask;
    int ThisTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    MPI_Datatype dtype;
    MPI_Type_contiguous(elsize, MPI_BYTE, &dtype);
    MPI_Type_commit(&dtype);

    int sendcount[NTask];
    int sdispls[NTask + 1];
    int i;

    MPI_Gather(&nrecv, 1, MPI_INT, sendcount, 1, MPI_INT, root, comm);

    sdispls[0] = 0;
    for(i = 1; i <= NTask; i ++) {
        sdispls[i] = sdispls[i - 1] + sendcount[i - 1];
    }

    if(recvbuffer == NULL)
        recvbuffer = MPIU_Malloc("recvbuffer", elsize, nrecv);

    if(ThisTask == root) {
        if(totalnsend)
            *totalnsend = sdispls[NTask];
    } else {
        if(totalnsend)
            *totalnsend = 0;
    }
    MPI_Scatterv(sendbuffer, sendcount, sdispls, dtype, recvbuffer, nrecv, dtype, root, comm);

    MPI_Type_free(&dtype);

    return recvbuffer;
}